

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

bool __thiscall
Sudoku::rowCheck(Sudoku *this,
                list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields
                ,bool recordFullFurtherWays,bool debug)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  ostream *poVar7;
  reference pvVar8;
  int si;
  int i;
  int x;
  int positionX;
  int nPossiblePositionsForValue;
  uint uStack_28;
  bool valueIsAlreadySet;
  int value;
  int y;
  bool restart;
  bool debug_local;
  bool recordFullFurtherWays_local;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields_local;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays__local;
  Sudoku *this_local;
  
  bVar1 = false;
  uStack_28 = 0;
  do {
    if (this->squared_size_ <= (int)uStack_28) {
      return bVar1;
    }
    for (nPossiblePositionsForValue = 1; nPossiblePositionsForValue <= this->squared_size_;
        nPossiblePositionsForValue = nPossiblePositionsForValue + 1) {
      bVar2 = false;
      x = 0;
      i = 0;
      for (si = 0; si < this->squared_size_; si = si + 1) {
        (*this->_vptr_Sudoku[7])(this,(ulong)(uint)si,(ulong)uStack_28);
        std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::size
                  (testFields);
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)si,(ulong)uStack_28);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](testFields,(long)iVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        iVar4 = Field::value(peVar6);
        if (iVar4 == nPossiblePositionsForValue) {
          bVar2 = true;
          break;
        }
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)si,(ulong)uStack_28);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](testFields,(long)iVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        bVar3 = Field::valuePossible(peVar6,nPossiblePositionsForValue);
        if (bVar3) {
          x = x + 1;
          i = si;
        }
        if (1 < x) break;
      }
      if ((x == 1) && (!bVar2)) {
        if (debug) {
          poVar7 = std::operator<<((ostream *)&std::cout,"  Row check (row ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_28);
          poVar7 = std::operator<<(poVar7,"): value ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,nPossiblePositionsForValue);
          poVar7 = std::operator<<(poVar7," has to be in field (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,i);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_28);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->current_z_);
          poVar7 = std::operator<<(poVar7,")");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        pvVar8 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        pvVar8->nRowCheckMatches = pvVar8->nRowCheckMatches + 1;
        pvVar8 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)i,(ulong)uStack_28);
        FurtherWays::addWay(pvVar8,iVar4,i,uStack_28,this->current_z_,nPossiblePositionsForValue,
                            onlyPositionInRow);
        if (!recordFullFurtherWays) {
          iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)i,(ulong)uStack_28);
          p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                   operator[](testFields,(long)iVar4);
          peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          Field::setValue(peVar6,nPossiblePositionsForValue);
          bVar1 = true;
          break;
        }
      }
    }
    if (bVar1 != false) {
      return bVar1;
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

bool Sudoku::rowCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check rows, if there are values that can only be at one position
  restart = false;

  // loop over rows
  for (int y = 0; y < squared_size_; y++)
  {
    // loop over all values
    for (int value = 1; value <= squared_size_; value++)
    {
      // check if value is already set (valueIsAlreadySet),
      // or can only be at exactly one position in this row (nPossiblePositionsForValue==1), then it is position positionX
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionX = 0;

      // loop over fields in row
      for (int x = 0; x < squared_size_; x++)
      {
        int i = index(x,y);
        int si = testFields.size();
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionX = x;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"  Row check (row "<<y<<"): value "<<value<<" has to be in field ("<<positionX<<","<<y<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nRowCheckMatches++;    // increment number of occurences that a value can only be at one position in a row
        furtherWays_.back().addWay(index(positionX,y), positionX, y, current_z_, value, FurtherWays::Reason::onlyPositionInRow);

        if(!recordFullFurtherWays)
        {
          testFields[index(positionX,y)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}